

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O1

word Gia_LutComputeTruth6Simple_rec(Gia_Man_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  long lVar2;
  uint uVar3;
  word wVar4;
  word wVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((-1 < iObj) && (iObj < p->nObjs)) {
    uVar6 = *(ulong *)(p->pObjs + (uint)iObj);
    if ((~uVar6 & 0x1fffffff1fffffff) == 0) {
      wVar4 = 0;
    }
    else if ((~(uint)uVar6 & 0x9fffffff) == 0) {
      wVar4 = *(word *)((long)s_Truths6 + (ulong)(uint)((int)(uVar6 >> 0x20) << 3));
    }
    else {
      pGVar1 = p->pObjs + (uint)iObj;
      wVar4 = Gia_LutComputeTruth6Simple_rec(p,iObj - ((uint)uVar6 & 0x1fffffff));
      wVar5 = Gia_LutComputeTruth6Simple_rec(p,iObj - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff));
      lVar2 = *(long *)pGVar1;
      uVar3 = (uint)lVar2;
      uVar6 = (long)((int)(uVar3 * 4) >> 0x1f) ^ wVar4;
      uVar7 = lVar2 * 4 >> 0x3f ^ wVar5;
      wVar4 = uVar6 & uVar7;
      if (((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) &&
          (uVar3 & 0x1fffffff) < ((uint)((ulong)lVar2 >> 0x20) & 0x1fffffff)) {
        wVar4 = uVar6 ^ uVar7;
      }
    }
    return wVar4;
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

word Gia_LutComputeTruth6Simple_rec( Gia_Man_t * p, int iObj )
{
    word Truth0, Truth1, Truth;
    Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
    if ( Gia_ObjIsConst0(pObj) )
        return 0;
    if ( Gia_ObjIsCi(pObj) )
        return s_Truths6[Gia_ObjCioId(pObj)];
    Truth0 = Gia_LutComputeTruth6Simple_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    Truth1 = Gia_LutComputeTruth6Simple_rec( p, Gia_ObjFaninId1(pObj, iObj) );
    Truth0 = Gia_ObjFaninC0(pObj) ? ~Truth0 : Truth0;
    Truth1 = Gia_ObjFaninC1(pObj) ? ~Truth1 : Truth1;
    Truth  = Gia_ObjIsXor(pObj) ? Truth0 ^ Truth1 : Truth0 & Truth1;
    return Truth;
}